

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osnetunix.h
# Opt level: O0

char * OS_CoreSocket::get_host_ip(char *hostname)

{
  hostent *phVar1;
  char *__s;
  size_t sVar2;
  char *in_RDI;
  char *buf;
  char *a;
  hostent *local_host;
  char *local_10;
  char *local_8;
  
  if (((in_RDI == (char *)0x0) || (local_10 = in_RDI, *in_RDI == '\0')) &&
     (local_10 = getenv("HOSTNAME"), local_10 == (char *)0x0)) {
    local_8 = (char *)0x0;
  }
  else {
    phVar1 = gethostbyname(local_10);
    if (phVar1 == (hostent *)0x0) {
      local_8 = (char *)0x0;
    }
    else {
      __s = inet_ntoa((in_addr)*(in_addr_t *)*phVar1->h_addr_list);
      if (__s == (char *)0x0) {
        local_8 = (char *)0x0;
      }
      else {
        sVar2 = strlen(__s);
        local_8 = (char *)operator_new__(sVar2 + 1);
        strcpy(local_8,__s);
      }
    }
  }
  return local_8;
}

Assistant:

static char *get_host_ip(const char *hostname)
    {
        /* 
         *   if no host name was specified, get the default local host name
         *   from the environment 
         */
        if (hostname == 0 || hostname[0] == '\0')
        {
            hostname = getenv("HOSTNAME");
            if (hostname == 0)
                return 0;
        }

        /* get the host entry for our local host name */
        struct hostent *local_host = gethostbyname(hostname);
        if (local_host == 0)
            return 0;

        /* get the IP address from the host entry structure */
        const char *a =
            inet_ntoa(*(struct in_addr *)local_host->h_addr_list[0]);
        if (a == 0)
            return 0;

        /* make an allocated copy of the buffer for the caller */
        char *buf = new char[strlen(a) + 1];
        strcpy(buf, a);

        /* return the allocated copy */
        return buf;
    }